

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O1

spv_result_t spvtools::val::AnnotationPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  ushort uVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __first;
  bool bVar4;
  bool bVar5;
  Decoration DVar6;
  spv_result_t id;
  uint uVar7;
  uint uVar8;
  FPFastMathModeMask FVar9;
  spv_result_t sVar10;
  Instruction *pIVar11;
  _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
  *p_Var12;
  mapped_type *pmVar13;
  pointer puVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  pointer ppVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dec_params;
  string local_258;
  ValidationState_t *local_230;
  string local_228;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  uint local_1e8;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x47:
    DVar6 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    if (pIVar11 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "target is not defined";
      lVar16 = 0x15;
    }
    else {
      bVar4 = spvIsVulkanEnv(_->context_->target_env);
      if (((DVar6 & ~DecorationSpecId) == DecorationGLSLShared) && (bVar4)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x123d,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpDecorate decoration \'",0x17);
        ValidationState_t::SpvDecorationString_abi_cxx11_(&local_228,_,DVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                    (uint)local_228._M_dataplus._M_p),local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"\' is not valid for the Vulkan execution environment.",0x34
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p) !=
            &local_228.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p
                                  ),local_228.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00638176;
      }
      if (DVar6 == DecorationFPFastMathMode) {
        bVar4 = ValidationState_t::HasDecoration(_,uVar7,DecorationNoContraction);
        if (!bVar4) {
          local_230 = _;
          FVar9 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(inst,2);
          _ = local_230;
          if ((~FVar9 & 0x30000) != 0 && (FVar9 >> 0x12 & 1) != 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,local_230,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       "AllowReassoc and AllowContract must be specified when AllowTransform is specified"
                       ,0x51);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            _ = local_230;
            sVar10 = local_38;
            break;
          }
          goto LAB_00638259;
        }
      }
      else {
LAB_00638259:
        if ((DVar6 != DecorationNoContraction) ||
           (bVar4 = ValidationState_t::HasDecoration(_,uVar7,DecorationFPFastMathMode), !bVar4)) {
          bVar4 = anon_unknown_3::DecorationTakesIdParameters(DVar6);
          if (!bVar4) {
            if ((pIVar11->inst_).opcode != 0x49) {
              if ((DVar6 < DecorationGLSLShared) && ((0xb0U >> (DVar6 & Component) & 1) != 0)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,_,DVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_258._M_dataplus._M_p,
                           local_258._M_string_length);
                pcVar18 = " can only be applied to structure members";
                lVar16 = 0x29;
                goto LAB_0063815e;
              }
              sVar10 = anon_unknown_3::ValidateDecorationTarget(_,DVar6,inst,pIVar11);
              if (sVar10 != SPV_SUCCESS) break;
            }
            goto LAB_00637e83;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "Decorations taking ID parameters may not be used with OpDecorateId";
          lVar16 = 0x42;
          goto LAB_006383d8;
        }
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "FPFastMathMode and NoContraction cannot decorate the same target";
      lVar16 = 0x40;
    }
LAB_006383d8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
LAB_006383ea:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar10 = local_38;
    break;
  case 0x48:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x1e)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpMemberDecorate Structure type <id> ",0x25);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      pcVar18 = " is not a struct type.";
      lVar16 = 0x16;
LAB_0063815e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
LAB_00638176:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      goto LAB_006383ea;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    if (uVar8 < (int)((ulong)((long)(pIVar11->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pIVar11->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) - 2U) {
      DVar6 = Instruction::GetOperandAs<spv::Decoration>(inst,2);
      sVar10 = SPV_SUCCESS;
      if ((int)DVar6 < 0x1175) {
        if ((DVar6 < (DecorationIndex|Centroid)) &&
           ((0xffc71c50074eU >> ((ulong)DVar6 & 0x3f) & 1) != 0)) {
LAB_0063802a:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,_,DVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," cannot be applied to structure members",0x27);
          sVar10 = local_38;
          goto LAB_0063837b;
        }
      }
      else if ((((DVar6 - DecorationNonUniform < 0x39) &&
                ((0x180000000000001U >> ((ulong)(DVar6 - DecorationNonUniform) & 0x3f) & 1) != 0))
               || (DVar6 - DecorationNoSignedWrap < 2)) || (DVar6 == CounterBuffer))
      goto LAB_0063802a;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," provided in OpMemberDecorate for struct <id> ",0x2e);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is out of bounds. The structure has ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," members. Largest valid index is ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
      sVar10 = local_38;
LAB_0063837b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    break;
  case 0x49:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    ppVar20 = (pIVar11->uses_).
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (pIVar11->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar10 = SPV_SUCCESS;
    if (ppVar20 != ppVar3) {
      do {
        uVar2 = (ppVar20->first->inst_).opcode;
        bVar4 = true;
        if ((((4 < uVar2 - 0x47) || ((0x19U >> (uVar2 - 0x47 & 0x1f) & 1) == 0)) && (uVar2 != 5)) &&
           ((uVar2 != 0x14c && (bVar5 = Instruction::IsNonSemantic(ppVar20->first), !bVar5)))) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Result id of OpDecorationGroup can only ",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"be targeted by OpName, OpGroupDecorate, ",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpDecorate, OpDecorateId, and OpGroupMemberDecorate",0x33
                    );
          local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,local_38);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar4 = false;
        }
        if (!bVar4) goto LAB_00638192;
        ppVar20 = ppVar20 + 1;
      } while (ppVar20 != ppVar3);
LAB_00637e83:
      sVar10 = SPV_SUCCESS;
    }
    break;
  case 0x4a:
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,id);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupDecorate Decoration group <id> ";
      lVar16 = 0x26;
LAB_006380ce:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      pcVar18 = " is not a decoration group.";
      lVar16 = 0x1b;
      goto LAB_0063815e;
    }
    sVar10 = SPV_SUCCESS;
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar19 = 1;
      uVar17 = 2;
      do {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar19);
        pIVar11 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar11 == (Instruction *)0x0) || (bVar4 = true, (pIVar11->inst_).opcode == 0x49)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupDecorate may not target OpDecorationGroup <id> ",
                     0x36);
          ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          id = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar4 = false;
        }
        sVar10 = id;
        if (!bVar4) goto LAB_006383ef;
        bVar4 = uVar17 < (ulong)((long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
        sVar19 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar4);
      goto LAB_00637e83;
    }
    break;
  case 0x4b:
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,id);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupMemberDecorate Decoration group <id> ";
      lVar16 = 0x2c;
      goto LAB_006380ce;
    }
    sVar10 = SPV_SUCCESS;
    if (0x20 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar19 = 2;
      do {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar19 - 1);
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,sVar19);
        pIVar11 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x1e)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupMemberDecorate Structure type <id> ",0x2a);
          ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          lVar16 = 0x16;
          pcVar18 = " is not a struct type.";
LAB_00637d4b:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
          local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar4 = false;
        }
        else {
          uVar15 = (int)((ulong)((long)(pIVar11->words_).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pIVar11->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) - 2;
          bVar4 = uVar8 < uVar15;
          if (!bVar4) {
            local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,uVar15);
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," provided in OpGroupMemberDecorate for struct <id> ",
                       0x33);
            ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is out of bounds. The structure has ",0x25);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," members. Largest valid index is ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            lVar16 = 1;
            pcVar18 = ".";
            goto LAB_00637d4b;
          }
        }
        if (!bVar4) goto LAB_00638192;
        sVar19 = sVar19 + 2;
      } while (sVar19 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
      goto LAB_00637e83;
    }
    break;
  default:
    if (uVar1 == 0x14c) {
      DVar6 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
      bVar4 = anon_unknown_3::DecorationTakesIdParameters(DVar6);
      sVar10 = SPV_SUCCESS;
      if (!bVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "Decorations that don\'t take ID parameters may not be used with OpDecorateId";
        lVar16 = 0x4b;
        goto LAB_006383d8;
      }
      break;
    }
    goto LAB_006383f8;
  }
LAB_006383ef:
  if (sVar10 != SPV_SUCCESS) {
    return sVar10;
  }
LAB_006383f8:
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x48:
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar7 = puVar14[1];
    uVar8 = puVar14[2];
    DVar6 = puVar14[3];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0x10 < (ulong)((long)(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar14)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar14 + 4);
    }
    local_208._0_4_ = DVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_228._M_dataplus._M_p._0_4_ = uVar7;
    local_1e8 = uVar8;
LAB_006384e9:
    p_Var12 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
               *)std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&_->id_decorations_,(key_type *)&local_228);
    std::
    _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
    ::_M_insert_unique<spvtools::val::Decoration_const&>(p_Var12,(Decoration *)local_208);
    if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_258._M_dataplus._M_p,
                      local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
    }
    break;
  case 0x49:
    break;
  case 0x4a:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14) < 9) {
      return SPV_SUCCESS;
    }
    uVar17 = 2;
    do {
      local_208._0_4_ = puVar14[uVar17];
      __first._M_node = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
                 *)std::
                   map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                   ::operator[](&_->id_decorations_,(key_type *)local_208);
      std::
      _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (p_Var12,__first,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
      uVar17 = uVar17 + 1;
      puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(inst->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar14 >> 2))
    ;
    break;
  case 0x4b:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14) < 0xd) {
      return SPV_SUCCESS;
    }
    uVar17 = 3;
    do {
      ValidationState_t::
      RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (_,puVar14[uVar17 - 1],puVar14[uVar17],
                 (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
      puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar17 = uVar17 + 2;
    } while (uVar17 < (ulong)((long)(inst->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar14 >> 2))
    ;
    break;
  default:
    if (uVar1 != 0x14c) {
      return SPV_SUCCESS;
    }
  case 0x47:
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar7 = puVar14[1];
    DVar6 = puVar14[2];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0xc < (ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar14)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar14 + 3);
    }
    local_208._0_4_ = DVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_1e8 = 0xffffffff;
    local_228._M_dataplus._M_p._0_4_ = uVar7;
    goto LAB_006384e9;
  }
  return SPV_SUCCESS;
LAB_00638192:
  sVar10 = (spv_result_t)local_230;
  goto LAB_006383ef;
}

Assistant:

spv_result_t AnnotationPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
      if (auto error = ValidateDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorateId:
      if (auto error = ValidateDecorateId(_, inst)) return error;
      break;
    // TODO(dneto): spv::Op::OpDecorateStringGOOGLE
    // See https://github.com/KhronosGroup/SPIRV-Tools/issues/2253
    case spv::Op::OpMemberDecorate:
      if (auto error = ValidateMemberDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorationGroup:
      if (auto error = ValidateDecorationGroup(_, inst)) return error;
      break;
    case spv::Op::OpGroupDecorate:
      if (auto error = ValidateGroupDecorate(_, inst)) return error;
      break;
    case spv::Op::OpGroupMemberDecorate:
      if (auto error = ValidateGroupMemberDecorate(_, inst)) return error;
      break;
    default:
      break;
  }

  // In order to validate decoration rules, we need to know all the decorations
  // that are applied to any given <id>.
  RegisterDecorations(_, inst);

  return SPV_SUCCESS;
}